

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqoptimizer.cpp
# Opt level: O0

bool __thiscall SQOptimizer::isUnsafeJumpRange(SQOptimizer *this,int start,int count)

{
  size_type sVar1;
  Jump *pJVar2;
  int in_EDX;
  int in_ESI;
  sqvector<SQOptimizer::Jump,_unsigned_int> *in_RDI;
  int to;
  int ie;
  int i;
  size_type local_1c;
  
  local_1c = 0;
  sVar1 = sqvector<SQOptimizer::Jump,_unsigned_int>::size(in_RDI);
  while( true ) {
    if ((int)sVar1 <= (int)local_1c) {
      return false;
    }
    pJVar2 = sqvector<SQOptimizer::Jump,_unsigned_int>::operator[](in_RDI,local_1c);
    if ((in_ESI < pJVar2->jumpTo) && (pJVar2->jumpTo < in_ESI + in_EDX)) break;
    local_1c = local_1c + 1;
  }
  return true;
}

Assistant:

bool SQOptimizer::isUnsafeJumpRange(int start, int count) const
{
    for (int i = 0, ie = jumps.size(); i < ie; i++) {
        int to = jumps[i].jumpTo;
        if (to > start && to < start + count)
            return true;
    }
    return false;
}